

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

size_t google::protobuf::internal::WireFormatLite::Int64Size(RepeatedField<long> *value)

{
  int iVar1;
  size_t sVar2;
  RepeatedField<long> *in_RDI;
  int i;
  int n;
  size_t out;
  int in_stack_0000009c;
  RepeatedField<long> *in_stack_000000a0;
  undefined4 local_18;
  undefined8 local_10;
  
  local_10 = 0;
  iVar1 = RepeatedField<long>::size(in_RDI);
  for (local_18 = 0; local_18 < iVar1; local_18 = local_18 + 1) {
    RepeatedField<long>::Get(in_stack_000000a0,in_stack_0000009c);
    sVar2 = Int64Size(0x448e65);
    local_10 = sVar2 + local_10;
  }
  return local_10;
}

Assistant:

size_t WireFormatLite::Int64Size(const RepeatedField<int64>& value) {
  size_t out = 0;
  const int n = value.size();
  for (int i = 0; i < n; i++) {
    out += Int64Size(value.Get(i));
  }
  return out;
}